

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QDockWidget * __thiscall QDockAreaLayoutInfo::apply(QDockAreaLayoutInfo *this,bool animate)

{
  long lVar1;
  byte animate_00;
  bool bVar2;
  int iVar3;
  QMainWindowLayout *pQVar4;
  QRect *this_00;
  qsizetype qVar5;
  reference pQVar6;
  undefined4 extraout_var;
  QRect *pQVar7;
  byte in_SIL;
  QDockAreaLayoutInfo *in_RDI;
  long in_FS_OFFSET;
  QWidget *in_stack_00000048;
  QDockWidget *dw;
  QWidget *w;
  QDockAreaLayoutItem *item;
  int i;
  QDockWidget *activated;
  QWidgetAnimator *widgetAnimator;
  QRect geo;
  QRect r;
  QSize tbh;
  QRect tab_rect;
  QRect *in_stack_fffffffffffffee8;
  QDockAreaLayoutInfo *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  ulong in_stack_ffffffffffffff30;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff40;
  int local_a4;
  QDockAreaLayoutInfo *local_a0;
  QWidgetAnimator *pQVar8;
  undefined7 in_stack_ffffffffffffff70;
  QDockAreaLayoutInfo *_final_geometry;
  QWidgetAnimator *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  animate_00 = in_SIL & 1;
  _final_geometry = in_RDI;
  pQVar4 = mainWindowLayout(in_stack_fffffffffffffef0);
  pQVar8 = &pQVar4->widgetAnimator;
  if ((in_RDI->tabbed & 1U) != 0) {
    QRect::QRect((QRect *)in_stack_fffffffffffffef0);
    tabBarSizeHint(in_stack_fffffffffffffef0);
    bVar2 = QSize::isNull((QSize *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    if (!bVar2) {
      in_stack_ffffffffffffff30 = (ulong)(uint)in_RDI->tabBarShape;
      switch(in_stack_ffffffffffffff30) {
      case 0:
      case 4:
        QRect::left((QRect *)0x572cb1);
        QRect::top((QRect *)0x572cc3);
        QRect::width(in_stack_fffffffffffffee8);
        QSize::height((QSize *)0x572ce6);
        QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),(int)in_stack_fffffffffffffef0,
                     (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(int)in_stack_fffffffffffffee8)
        ;
        break;
      case 1:
      case 5:
        QRect::left((QRect *)0x572d35);
        QRect::bottom((QRect *)0x572d47);
        QSize::height((QSize *)0x572d58);
        QRect::width(in_stack_fffffffffffffee8);
        QSize::height((QSize *)0x572d86);
        QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),(int)in_stack_fffffffffffffef0,
                     (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(int)in_stack_fffffffffffffee8)
        ;
        break;
      case 2:
      case 6:
        in_stack_fffffffffffffef8 = QRect::left((QRect *)0x572e75);
        in_stack_fffffffffffffefc = QRect::top((QRect *)0x572e87);
        in_stack_ffffffffffffff00 = QSize::width((QSize *)0x572e98);
        QRect::height(in_stack_fffffffffffffee8);
        QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),(int)in_stack_fffffffffffffef0,
                     (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(int)in_stack_fffffffffffffee8)
        ;
        break;
      case 3:
      case 7:
        in_stack_ffffffffffffff04 = QRect::right((QRect *)0x572dd5);
        QSize::width((QSize *)0x572de6);
        QRect::top((QRect *)0x572e03);
        QSize::width((QSize *)0x572e14);
        QRect::height(in_stack_fffffffffffffee8);
        QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),(int)in_stack_fffffffffffffef0,
                     (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(int)in_stack_fffffffffffffee8)
        ;
      }
    }
    QWidgetAnimator::animate
              (in_stack_ffffffffffffff80,in_stack_00000048,(QRect *)_final_geometry,(bool)animate_00
              );
  }
  local_a0 = (QDockAreaLayoutInfo *)0x0;
  local_a4 = 0;
  while( true ) {
    this_00 = (QRect *)(long)local_a4;
    qVar5 = QList<QDockAreaLayoutItem>::size(&in_RDI->item_list);
    if (qVar5 <= (long)this_00) break;
    pQVar6 = QList<QDockAreaLayoutItem>::operator[]
                       ((QList<QDockAreaLayoutItem> *)this_00,(qsizetype)in_stack_fffffffffffffee8);
    if ((pQVar6->flags & 1) == 0) {
      if (pQVar6->subinfo == (QDockAreaLayoutInfo *)0x0) {
        bVar2 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        if (!bVar2) {
          itemRect(in_RDI,(int)(in_stack_ffffffffffffff30 >> 0x20),
                   SUB81(in_stack_ffffffffffffff30 >> 0x18,0));
          iVar3 = (*pQVar6->widgetItem->_vptr_QLayoutItem[0xd])();
          pQVar7 = QWidget::geometry((QWidget *)CONCAT44(extraout_var,iVar3));
          QWidgetAnimator::animate
                    (*(QWidgetAnimator **)pQVar7,in_stack_00000048,(QRect *)_final_geometry,
                     (bool)animate_00);
          bVar2 = QWidget::isHidden((QWidget *)0x57308c);
          if (!bVar2) {
            QWidget::window((QWidget *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                           );
            bVar2 = QWidget::isVisible((QWidget *)0x5730a6);
            if (bVar2) {
              in_stack_ffffffffffffff40 =
                   (QDockAreaLayoutInfo *)qobject_cast<QDockWidget*>((QObject *)0x5730b9);
              bVar2 = QRect::isValid(this_00);
              if (((bVar2) || (iVar3 = QRect::right((QRect *)0x5730dc), iVar3 < 0)) ||
                 (iVar3 = QRect::bottom((QRect *)0x5730ee), iVar3 < 0)) {
                bVar2 = QRect::isValid(this_00);
                if ((bVar2) &&
                   ((iVar3 = QRect::right((QRect *)0x57312b), iVar3 < 0 ||
                    (iVar3 = QRect::bottom((QRect *)0x57313d), iVar3 < 0)))) {
                  QDockWidget::visibilityChanged
                            ((QDockWidget *)0x573151,
                             SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
                  local_a0 = in_stack_ffffffffffffff40;
                }
              }
              else {
                QWidget::lower((QWidget *)
                               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
                QDockWidget::visibilityChanged
                          ((QDockWidget *)0x573109,SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0)
                          );
              }
            }
          }
        }
      }
      else {
        apply((QDockAreaLayoutInfo *)CONCAT17(animate_00,in_stack_ffffffffffffff70),
              SUB81((ulong)pQVar8 >> 0x38,0));
      }
    }
    local_a4 = local_a4 + 1;
  }
  if (*in_RDI->sep == 1) {
    updateSeparatorWidgets(in_stack_ffffffffffffff40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDockWidget *)local_a0;
}

Assistant:

QDockWidget *QDockAreaLayoutInfo::apply(bool animate)
{
    QWidgetAnimator &widgetAnimator = mainWindowLayout()->widgetAnimator;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        QRect tab_rect;
        QSize tbh = tabBarSizeHint();

        if (!tbh.isNull()) {
            switch (tabBarShape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                    tab_rect = QRect(rect.left(), rect.top(), rect.width(), tbh.height());
                    break;
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    tab_rect = QRect(rect.left(), rect.bottom() - tbh.height() + 1,
                                        rect.width(), tbh.height());
                    break;
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    tab_rect = QRect(rect.right() - tbh.width() + 1, rect.top(),
                                        tbh.width(), rect.height());
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                    tab_rect = QRect(rect.left(), rect.top(),
                                        tbh.width(), rect.height());
                    break;
                default:
                    break;
            }
        }

        widgetAnimator.animate(tabBar, tab_rect, animate);
    }
#endif // QT_CONFIG(tabbar)

    QDockWidget *activated = nullptr;

    for (int i = 0; i < item_list.size(); ++i) {
        QDockAreaLayoutItem &item = item_list[i];

        if (item.flags & QDockAreaLayoutItem::GapItem)
            continue;

        if (item.subinfo != nullptr) {
            item.subinfo->apply(animate);
            continue;
        }

        if (item.skip())
            continue;

        Q_ASSERT(item.widgetItem);
        QRect r = itemRect(i);
        QWidget *w = item.widgetItem->widget();

        QRect geo = w->geometry();
        widgetAnimator.animate(w, r, animate);
        if (!w->isHidden() && w->window()->isVisible()) {
            QDockWidget *dw = qobject_cast<QDockWidget*>(w);
            if (!r.isValid() && geo.right() >= 0 && geo.bottom() >= 0) {
                dw->lower();
                emit dw->visibilityChanged(false);
            } else if (r.isValid()
                        && (geo.right() < 0 || geo.bottom() < 0)) {
                emit dw->visibilityChanged(true);
                activated = dw;
            }
        }
    }
#if QT_CONFIG(tabbar)
    if (*sep == 1)
        updateSeparatorWidgets();
#endif // QT_CONFIG(tabbar)

    return activated;
}